

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

void setCompDefaults(jpeg_compress_struct *cinfo,int pixelFormat,int subsamp,int jpegQual,int flags)

{
  int iVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  char *pcVar4;
  J_COLOR_SPACE colorspace;
  char tempc;
  int temp;
  
  cinfo->in_color_space = pf2cs[pixelFormat];
  cinfo->input_components = tjPixelSize[pixelFormat];
  jpeg_set_defaults(cinfo);
  pcVar4 = getenv("TJ_OPTIMIZE");
  if (((pcVar4 != (char *)0x0) && (*pcVar4 == '1')) && (pcVar4[1] == '\0')) {
    cinfo->optimize_coding = 1;
  }
  pcVar4 = getenv("TJ_ARITHMETIC");
  if (((pcVar4 != (char *)0x0) && (*pcVar4 == '1')) && (pcVar4[1] == '\0')) {
    cinfo->arith_code = 1;
  }
  pcVar4 = getenv("TJ_RESTART");
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    __isoc99_sscanf(pcVar4,"%d%c",&temp);
  }
  if (-1 < jpegQual) {
    jpeg_set_quality(cinfo,jpegQual,1);
    cinfo->dct_method = (uint)(((uint)flags >> 0xc & 1) == 0 && (uint)jpegQual < 0x60);
  }
  colorspace = (pixelFormat == 0xb) + 3 + (uint)(pixelFormat == 0xb);
  if (subsamp == 3) {
    colorspace = JCS_GRAYSCALE;
  }
  jpeg_set_colorspace(cinfo,colorspace);
  if ((((uint)flags >> 0xe & 1) != 0) ||
     (((pcVar4 = getenv("TJ_PROGRESSIVE"), pcVar4 != (char *)0x0 && (*pcVar4 == '1')) &&
      (pcVar4[1] == '\0')))) {
    jpeg_simple_progression(cinfo);
  }
  iVar1 = tjMCUWidth[subsamp];
  pjVar3 = cinfo->comp_info;
  pjVar3->h_samp_factor = iVar1 / 8;
  pjVar3[1].h_samp_factor = 1;
  pjVar3[2].h_samp_factor = 1;
  iVar2 = cinfo->num_components;
  if (3 < iVar2) {
    pjVar3[3].h_samp_factor = iVar1 / 8;
  }
  iVar1 = tjMCUHeight[subsamp];
  pjVar3->v_samp_factor = iVar1 / 8;
  pjVar3[1].v_samp_factor = 1;
  pjVar3[2].v_samp_factor = 1;
  if (3 < iVar2) {
    pjVar3[3].v_samp_factor = iVar1 / 8;
  }
  return;
}

Assistant:

static void setCompDefaults(struct jpeg_compress_struct *cinfo,
                            int pixelFormat, int subsamp, int jpegQual,
                            int flags)
{
#ifndef NO_GETENV
  char *env = NULL;
#endif

  cinfo->in_color_space = pf2cs[pixelFormat];
  cinfo->input_components = tjPixelSize[pixelFormat];
  jpeg_set_defaults(cinfo);

#ifndef NO_GETENV
  if ((env = getenv("TJ_OPTIMIZE")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->optimize_coding = TRUE;
  if ((env = getenv("TJ_ARITHMETIC")) != NULL && strlen(env) > 0 &&
      !strcmp(env, "1"))
    cinfo->arith_code = TRUE;
  if ((env = getenv("TJ_RESTART")) != NULL && strlen(env) > 0) {
    int temp = -1;
    char tempc = 0;

    if (sscanf(env, "%d%c", &temp, &tempc) >= 1 && temp >= 0 &&
        temp <= 65535) {
      if (toupper(tempc) == 'B') {
        cinfo->restart_interval = temp;
        cinfo->restart_in_rows = 0;
      } else
        cinfo->restart_in_rows = temp;
    }
  }
#endif

  if (jpegQual >= 0) {
    jpeg_set_quality(cinfo, jpegQual, TRUE);
    if (jpegQual >= 96 || flags & TJFLAG_ACCURATEDCT)
      cinfo->dct_method = JDCT_ISLOW;
    else
      cinfo->dct_method = JDCT_FASTEST;
  }
  if (subsamp == TJSAMP_GRAY)
    jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);
  else if (pixelFormat == TJPF_CMYK)
    jpeg_set_colorspace(cinfo, JCS_YCCK);
  else
    jpeg_set_colorspace(cinfo, JCS_YCbCr);

  if (flags & TJFLAG_PROGRESSIVE)
    jpeg_simple_progression(cinfo);
#ifndef NO_GETENV
  else if ((env = getenv("TJ_PROGRESSIVE")) != NULL && strlen(env) > 0 &&
           !strcmp(env, "1"))
    jpeg_simple_progression(cinfo);
#endif

  cinfo->comp_info[0].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[1].h_samp_factor = 1;
  cinfo->comp_info[2].h_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].h_samp_factor = tjMCUWidth[subsamp] / 8;
  cinfo->comp_info[0].v_samp_factor = tjMCUHeight[subsamp] / 8;
  cinfo->comp_info[1].v_samp_factor = 1;
  cinfo->comp_info[2].v_samp_factor = 1;
  if (cinfo->num_components > 3)
    cinfo->comp_info[3].v_samp_factor = tjMCUHeight[subsamp] / 8;
}